

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O1

Contrib_List *
crnlib::Resampler::make_clist
          (int src_x,int dst_x,Boundary_Op boundary_op,_func_Resample_Real_Resample_Real *Pfilter,
          Resample_Real filter_support,Resample_Real filter_scale,Resample_Real src_ofs)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Contrib_List *p;
  Contrib_List *pCVar4;
  uint uVar5;
  Contrib *pCVar6;
  uint uVar7;
  ulong uVar8;
  Contrib_List *pCVar9;
  undefined8 *puVar10;
  int iVar11;
  int iVar12;
  Contrib_List *pCVar13;
  Contrib_List *pCVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Resample_Real RVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float local_94;
  float local_78;
  Contrib *local_40;
  
  p = (Contrib_List *)crnlib_calloc((long)dst_x,0x10,(size_t *)0x0);
  if (p == (Contrib_List *)0x0) {
    return (Contrib_List *)0x0;
  }
  pCVar4 = (Contrib_List *)crnlib_calloc((long)dst_x,0xc,(size_t *)0x0);
  pCVar9 = p;
  pCVar14 = (Contrib_List *)0x0;
  if (pCVar4 == (Contrib_List *)0x0) goto LAB_001523cf;
  fVar21 = 1.0 / filter_scale;
  fVar22 = (float)dst_x / (float)src_x;
  pCVar9 = pCVar4;
  pCVar14 = p;
  if (1.0 <= fVar22) {
    if (dst_x < 1) {
      iVar12 = 0;
    }
    else {
      puVar10 = (undefined8 *)&pCVar4->field_0x4;
      uVar8 = 0;
      iVar12 = 0;
      do {
        fVar15 = ((float)(int)uVar8 + 0.5) / fVar22 + -0.5 + src_ofs;
        fVar16 = floorf(fVar15 - filter_support * filter_scale);
        fVar17 = ceilf(filter_support * filter_scale + fVar15);
        *(float *)((long)puVar10 + -4) = fVar15;
        *puVar10 = CONCAT44((int)fVar17,(int)fVar16);
        iVar12 = (iVar12 - (int)fVar16) + (int)fVar17 + 1;
        uVar8 = uVar8 + 1;
        puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      } while ((uint)dst_x != uVar8);
    }
    if ((iVar12 != 0) &&
       (local_40 = (Contrib *)crnlib_calloc((long)iVar12,8,(size_t *)0x0),
       local_40 != (Contrib *)0x0)) {
      if (0 < dst_x) {
        uVar8 = 0;
        pCVar6 = local_40;
        do {
          fVar22 = *(float *)(&pCVar4->n + uVar8 * 6);
          iVar12 = *(int *)(&pCVar4->field_0x4 + uVar8 * 0xc);
          iVar2 = *(int *)((long)&pCVar4->p + uVar8 * 0xc);
          p[uVar8].n = 0;
          p[uVar8].p = pCVar6;
          fVar15 = 0.0;
          iVar3 = iVar2 - iVar12;
          if (iVar12 <= iVar2) {
            iVar11 = iVar12;
            do {
              RVar19 = (*Pfilter)((fVar22 - (float)iVar11) * fVar21);
              fVar15 = fVar15 + RVar19;
              iVar11 = iVar11 + 1;
            } while (iVar2 + 1 != iVar11);
          }
          pCVar13 = p + uVar8;
          if (iVar2 < iVar12) {
            uVar5 = 0xffffffff;
            local_94 = 0.0;
          }
          else {
            local_94 = 0.0;
            fVar16 = -1e+20;
            uVar7 = 0xffffffff;
            do {
              RVar19 = (*Pfilter)((fVar22 - (float)iVar12) * fVar21);
              fVar17 = RVar19 * (1.0 / fVar15);
              if ((fVar17 != 0.0) || (fVar18 = fVar16, uVar5 = uVar7, NAN(fVar17))) {
                iVar11 = reflect(iVar12,src_x,boundary_op);
                uVar1 = pCVar13->n;
                pCVar13->n = uVar1 + 1;
                *(short *)((long)&pCVar13->p->pixel + (ulong)((uint)uVar1 * 8)) = (short)iVar11;
                *(float *)((long)&pCVar13->p->weight + (ulong)((uint)uVar1 * 8)) = fVar17;
                local_94 = local_94 + fVar17;
                fVar18 = fVar17;
                uVar5 = (uint)uVar1;
                if (fVar17 <= fVar16) {
                  fVar18 = fVar16;
                  uVar5 = uVar7;
                }
              }
              iVar12 = iVar12 + 1;
              fVar16 = fVar18;
              uVar7 = uVar5;
            } while (iVar2 + 1 != iVar12);
          }
          if ((uVar5 == 0xffffffff) || (pCVar13->n == 0)) goto LAB_001523b3;
          if ((local_94 != 1.0) || (NAN(local_94))) {
            pCVar13->p[uVar5].weight = (1.0 - local_94) + pCVar13->p[uVar5].weight;
          }
          pCVar6 = pCVar6 + (iVar3 + 1);
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)dst_x);
      }
      goto LAB_001523cf;
    }
  }
  else {
    if (dst_x < 1) {
      iVar12 = 0;
    }
    else {
      fVar15 = (filter_support / fVar22) * filter_scale;
      puVar10 = (undefined8 *)&pCVar4->field_0x4;
      uVar8 = 0;
      iVar12 = 0;
      do {
        fVar16 = ((float)(int)uVar8 + 0.5) / fVar22 + -0.5 + src_ofs;
        fVar17 = floorf(fVar16 - fVar15);
        fVar18 = ceilf(fVar15 + fVar16);
        *(float *)((long)puVar10 + -4) = fVar16;
        *puVar10 = CONCAT44((int)fVar18,(int)fVar17);
        iVar12 = (iVar12 - (int)fVar17) + (int)fVar18 + 1;
        uVar8 = uVar8 + 1;
        puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      } while ((uint)dst_x != uVar8);
    }
    if ((iVar12 != 0) &&
       (local_40 = (Contrib *)crnlib_calloc((long)iVar12,8,(size_t *)0x0),
       local_40 != (Contrib *)0x0)) {
      if (0 < dst_x) {
        uVar8 = 0;
        pCVar6 = local_40;
        do {
          fVar15 = *(float *)(&pCVar4->n + uVar8 * 6);
          iVar12 = *(int *)(&pCVar4->field_0x4 + uVar8 * 0xc);
          iVar2 = *(int *)((long)&pCVar4->p + uVar8 * 0xc);
          p[uVar8].n = 0;
          p[uVar8].p = pCVar6;
          fVar16 = 0.0;
          iVar3 = iVar2 - iVar12;
          if (iVar12 <= iVar2) {
            iVar11 = iVar12;
            do {
              RVar19 = (*Pfilter)((fVar15 - (float)iVar11) * fVar22 * fVar21);
              fVar16 = fVar16 + RVar19;
              iVar11 = iVar11 + 1;
            } while (iVar2 + 1 != iVar11);
          }
          pCVar13 = p + uVar8;
          if (iVar2 < iVar12) {
            uVar5 = 0xffffffff;
            local_78 = 0.0;
          }
          else {
            local_78 = 0.0;
            fVar17 = -1e+20;
            uVar7 = 0xffffffff;
            do {
              RVar19 = (*Pfilter)((fVar15 - (float)iVar12) * fVar22 * fVar21);
              fVar18 = RVar19 * (1.0 / fVar16);
              if ((fVar18 != 0.0) || (fVar20 = fVar17, uVar5 = uVar7, NAN(fVar18))) {
                iVar11 = reflect(iVar12,src_x,boundary_op);
                uVar1 = pCVar13->n;
                pCVar13->n = uVar1 + 1;
                *(short *)((long)&pCVar13->p->pixel + (ulong)((uint)uVar1 * 8)) = (short)iVar11;
                *(float *)((long)&pCVar13->p->weight + (ulong)((uint)uVar1 * 8)) = fVar18;
                local_78 = local_78 + fVar18;
                fVar20 = fVar18;
                uVar5 = (uint)uVar1;
                if (fVar18 <= fVar17) {
                  fVar20 = fVar17;
                  uVar5 = uVar7;
                }
              }
              iVar12 = iVar12 + 1;
              fVar17 = fVar20;
              uVar7 = uVar5;
            } while (iVar2 + 1 != iVar12);
          }
          if ((uVar5 == 0xffffffff) || (pCVar13->n == 0)) goto LAB_001523b3;
          if ((local_78 != 1.0) || (NAN(local_78))) {
            pCVar13->p[uVar5].weight = (1.0 - local_78) + pCVar13->p[uVar5].weight;
          }
          pCVar6 = pCVar6 + (iVar3 + 1);
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)dst_x);
      }
      goto LAB_001523cf;
    }
  }
LAB_001523bd:
  crnlib_free(p);
  pCVar14 = (Contrib_List *)0x0;
LAB_001523cf:
  crnlib_free(pCVar9);
  return pCVar14;
LAB_001523b3:
  crnlib_free(local_40);
  goto LAB_001523bd;
}

Assistant:

Resampler::Contrib_List* Resampler::make_clist(
    int src_x, int dst_x, Boundary_Op boundary_op,
    Resample_Real (*Pfilter)(Resample_Real),
    Resample_Real filter_support,
    Resample_Real filter_scale,
    Resample_Real src_ofs) {
  typedef struct
  {
    // The center of the range in DISCRETE coordinates (pixel center = 0.0f).
    Resample_Real center;
    int left, right;
  } Contrib_Bounds;

  int i, j, k, n, left, right;
  Resample_Real total_weight;
  Resample_Real xscale, center, half_width, weight;
  Contrib_List* Pcontrib;
  Contrib* Pcpool;
  Contrib* Pcpool_next;
  Contrib_Bounds* Pcontrib_bounds;

  if ((Pcontrib = (Contrib_List*)crnlib_calloc(dst_x, sizeof(Contrib_List))) == NULL)
    return NULL;

  Pcontrib_bounds = (Contrib_Bounds*)crnlib_calloc(dst_x, sizeof(Contrib_Bounds));
  if (!Pcontrib_bounds) {
    crnlib_free(Pcontrib);
    return (NULL);
  }

  const Resample_Real oo_filter_scale = 1.0f / filter_scale;

  const Resample_Real NUDGE = 0.5f;
  xscale = dst_x / (Resample_Real)src_x;

  if (xscale < 1.0f) {
    int total;
    (void)total;

    /* Handle case when there are fewer destination
         * samples than source samples (downsampling/minification).
         */

    // stretched half width of filter
    half_width = (filter_support / xscale) * filter_scale;

    // Find the range of source sample(s) that will contribute to each destination sample.

    for (i = 0, n = 0; i < dst_x; i++) {
      // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
      center = ((Resample_Real)i + NUDGE) / xscale;
      center -= NUDGE;
      center += src_ofs;

      left = cast_to_int((Resample_Real)floor(center - half_width));
      right = cast_to_int((Resample_Real)ceil(center + half_width));

      Pcontrib_bounds[i].center = center;
      Pcontrib_bounds[i].left = left;
      Pcontrib_bounds[i].right = right;

      n += (right - left + 1);
    }

    /* Allocate memory for contributors. */

    if ((n == 0) || ((Pcpool = (Contrib*)crnlib_calloc(n, sizeof(Contrib))) == NULL)) {
      crnlib_free(Pcontrib);
      crnlib_free(Pcontrib_bounds);
      return NULL;
    }
    total = n;

    Pcpool_next = Pcpool;

    /* Create the list of source samples which
         * contribute to each destination sample.
         */

    for (i = 0; i < dst_x; i++) {
      int max_k = -1;
      Resample_Real max_w = -1e+20f;

      center = Pcontrib_bounds[i].center;
      left = Pcontrib_bounds[i].left;
      right = Pcontrib_bounds[i].right;

      Pcontrib[i].n = 0;
      Pcontrib[i].p = Pcpool_next;
      Pcpool_next += (right - left + 1);
      resampler_assert((Pcpool_next - Pcpool) <= total);

      total_weight = 0;

      for (j = left; j <= right; j++)
        total_weight += (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale);
      const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

      total_weight = 0;

#if RESAMPLER_DEBUG
      printf("%i: ", i);
#endif

      for (j = left; j <= right; j++) {
        weight = (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale) * norm;
        if (weight == 0.0f)
          continue;

        n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
        printf("%i(%f), ", n, weight);
#endif

        /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

        k = Pcontrib[i].n++;

        Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
        Pcontrib[i].p[k].weight = weight;           /* store src sample weight */

        total_weight += weight; /* total weight of all contributors */

        if (weight > max_w) {
          max_w = weight;
          max_k = k;
        }
      }

#if RESAMPLER_DEBUG
      printf("\n\n");
#endif

      //resampler_assert(Pcontrib[i].n);
      //resampler_assert(max_k != -1);
      if ((max_k == -1) || (Pcontrib[i].n == 0)) {
        crnlib_free(Pcpool);
        crnlib_free(Pcontrib);
        crnlib_free(Pcontrib_bounds);
        return NULL;
      }

      if (total_weight != 1.0f)
        Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
    }
  } else {
    /* Handle case when there are more
         * destination samples than source
         * samples (upsampling).
         */

    half_width = filter_support * filter_scale;

    // Find the source sample(s) that contribute to each destination sample.

    for (i = 0, n = 0; i < dst_x; i++) {
      // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
      center = ((Resample_Real)i + NUDGE) / xscale;
      center -= NUDGE;
      center += src_ofs;

      left = cast_to_int((Resample_Real)floor(center - half_width));
      right = cast_to_int((Resample_Real)ceil(center + half_width));

      Pcontrib_bounds[i].center = center;
      Pcontrib_bounds[i].left = left;
      Pcontrib_bounds[i].right = right;

      n += (right - left + 1);
    }

    /* Allocate memory for contributors. */

    int total = n;
    if ((total == 0) || ((Pcpool = (Contrib*)crnlib_calloc(total, sizeof(Contrib))) == NULL)) {
      crnlib_free(Pcontrib);
      crnlib_free(Pcontrib_bounds);
      return NULL;
    }

    Pcpool_next = Pcpool;

    /* Create the list of source samples which
         * contribute to each destination sample.
         */

    for (i = 0; i < dst_x; i++) {
      int max_k = -1;
      Resample_Real max_w = -1e+20f;

      center = Pcontrib_bounds[i].center;
      left = Pcontrib_bounds[i].left;
      right = Pcontrib_bounds[i].right;

      Pcontrib[i].n = 0;
      Pcontrib[i].p = Pcpool_next;
      Pcpool_next += (right - left + 1);
      resampler_assert((Pcpool_next - Pcpool) <= total);

      total_weight = 0;
      for (j = left; j <= right; j++)
        total_weight += (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale);

      const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

      total_weight = 0;

#if RESAMPLER_DEBUG
      printf("%i: ", i);
#endif

      for (j = left; j <= right; j++) {
        weight = (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale) * norm;
        if (weight == 0.0f)
          continue;

        n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
        printf("%i(%f), ", n, weight);
#endif

        /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

        k = Pcontrib[i].n++;

        Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
        Pcontrib[i].p[k].weight = weight;           /* store src sample weight */

        total_weight += weight; /* total weight of all contributors */

        if (weight > max_w) {
          max_w = weight;
          max_k = k;
        }
      }

#if RESAMPLER_DEBUG
      printf("\n\n");
#endif

      //resampler_assert(Pcontrib[i].n);
      //resampler_assert(max_k != -1);

      if ((max_k == -1) || (Pcontrib[i].n == 0)) {
        crnlib_free(Pcpool);
        crnlib_free(Pcontrib);
        crnlib_free(Pcontrib_bounds);
        return NULL;
      }

      if (total_weight != 1.0f)
        Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
    }
  }

#if RESAMPLER_DEBUG
  printf("*******\n");
#endif

  crnlib_free(Pcontrib_bounds);

  return Pcontrib;
}